

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O0

void __thiscall banksia::ChessBoard::takeBack(ChessBoard *this,Hist *hist)

{
  int iVar1;
  Piece PVar2;
  Side *in_RSI;
  Piece in_RDI;
  int newRookPos;
  int rookPos;
  int capPos;
  Piece movep;
  Side in_stack_ffffffffffffffa8;
  Side _side;
  PieceType in_stack_ffffffffffffffac;
  PieceType local_18;
  
  PVar2 = BoardCore::getPiece((BoardCore *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
  BoardCore::setPiece((BoardCore *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0,
                      in_RDI);
  local_18 = PVar2.type;
  if ((local_18 == pawn) && (in_RSI[7] == in_RSI[1])) {
    BoardCore::setEmpty((BoardCore *)in_RDI,in_stack_ffffffffffffffac);
  }
  BoardCore::setPiece((BoardCore *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0,
                      in_RDI);
  if (local_18 == king) {
    iVar1 = *in_RSI - in_RSI[1];
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    if (iVar1 == 2) {
      iVar1 = -4;
      if ((int)*in_RSI < (int)in_RSI[1]) {
        iVar1 = 3;
      }
      in_stack_ffffffffffffffac = *in_RSI + iVar1;
      Piece::Piece((Piece *)in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      BoardCore::setPiece((BoardCore *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                          ,0,in_RDI);
      BoardCore::setEmpty((BoardCore *)in_RDI,in_stack_ffffffffffffffac);
    }
  }
  if (in_RSI[2] != black) {
    _side = *in_RSI;
    Piece::Piece((Piece *)in_RDI,in_stack_ffffffffffffffac,_side);
    BoardCore::setPiece((BoardCore *)CONCAT44(in_stack_ffffffffffffffac,_side),0,in_RDI);
  }
  *(Side *)((long)in_RDI + 0x40) = in_RSI[8];
  *(char *)((long)in_RDI + 0xb4) = (char)in_RSI[9];
  *(byte *)((long)in_RDI + 0xb5) = *(byte *)((long)in_RSI + 0x25);
  *(Side *)((long)in_RDI + 0xb0) = in_RSI[7];
  *(Side *)((long)in_RDI + 0x70) = in_RSI[0xc];
  *(undefined8 *)((long)in_RDI + 0x78) = *(undefined8 *)(in_RSI + 10);
  return;
}

Assistant:

void ChessBoard::takeBack(const Hist& hist) {
    auto movep = getPiece(hist.move.dest);
    setPiece(hist.move.from, movep);
    
    int capPos = hist.move.dest;
    
    if (movep.type == PieceType::pawn && hist.enpassant == hist.move.dest) {
        capPos = hist.move.dest + (movep.side == Side::white ? +8 : -8);
        setEmpty(hist.move.dest);
    }
    setPiece(capPos, hist.cap);
    
    if (movep.type == PieceType::king) {
        if (abs(hist.move.from - hist.move.dest) == 2) {
            int rookPos = hist.move.from + (hist.move.from < hist.move.dest ? 3 : -4);
            assert(isEmpty(rookPos));
            int newRookPos = (hist.move.from + hist.move.dest) / 2;
            setPiece(rookPos, Piece(PieceType::rook, hist.move.dest < 8 ? Side::black : Side::white));
            setEmpty(newRookPos);
        }
    }
    
    if (hist.move.promotion != PieceType::empty) {
        setPiece(hist.move.from, Piece(PieceType::pawn, hist.move.dest < 8 ? Side::white : Side::black));
    }
    
    status = hist.status;
    castleRights[0] = hist.castleRights[0];
    castleRights[1] = hist.castleRights[1];
    enpassant = hist.enpassant;
    quietCnt = hist.quietCnt;
    
    //    pieceList_takeback(hist);
    hashKey = hist.hashKey;
}